

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O2

void __thiscall cbtTaskSchedulerDefault::setNumThreads(cbtTaskSchedulerDefault *this,int numThreads)

{
  WorkerThreadDirectives *pWVar1;
  int iVar2;
  int i;
  long lVar3;
  long lVar4;
  
  if (this->m_maxNumThreads < numThreads) {
    numThreads = this->m_maxNumThreads;
  }
  iVar2 = 1;
  if (1 < numThreads) {
    iVar2 = numThreads;
  }
  this->m_numActiveJobQueues = 0;
  this->m_numThreads = iVar2;
  this->m_numWorkerThreads = iVar2 - 1U;
  if (1 < numThreads) {
    lVar4 = 0;
    this->m_numActiveJobQueues =
         (int)(((long)(this->m_perThreadJobQueues).m_data[iVar2 - 1U] -
               (long)(this->m_jobQueues).m_data) / 0xb8) + 1;
    for (lVar3 = 0; lVar3 < (this->m_jobQueues).m_size; lVar3 = lVar3 + 1) {
      JobQueue::setupJobStealing
                ((JobQueue *)(((this->m_jobQueues).m_data)->m_cachePadding + lVar4 + -0x78),
                 &this->m_jobQueues,this->m_numActiveJobQueues);
      lVar4 = lVar4 + 0xb8;
    }
    iVar2 = this->m_numThreads;
  }
  pWVar1 = this->m_workerDirective;
  for (lVar3 = (long)iVar2; lVar3 < 0x40; lVar3 = lVar3 + 1) {
    pWVar1[lVar3] = (WorkerThreadDirectives)0x1;
  }
  return;
}

Assistant:

virtual void setNumThreads(int numThreads) BT_OVERRIDE
	{
		m_numThreads = cbtMax(cbtMin(numThreads, int(m_maxNumThreads)), 1);
		m_numWorkerThreads = m_numThreads - 1;
		m_numActiveJobQueues = 0;
		// if there is at least 1 worker,
		if (m_numWorkerThreads > 0)
		{
			// re-setup job stealing between queues to avoid attempting to steal from an inactive job queue
			JobQueue* lastActiveContext = m_perThreadJobQueues[m_numThreads - 1];
			int iLastActiveContext = lastActiveContext - &m_jobQueues[0];
			m_numActiveJobQueues = iLastActiveContext + 1;
			for (int i = 0; i < m_jobQueues.size(); ++i)
			{
				m_jobQueues[i].setupJobStealing(&m_jobQueues, m_numActiveJobQueues);
			}
		}
		m_workerDirective->setDirectiveByRange(m_numThreads, BT_MAX_THREAD_COUNT, WorkerThreadDirectives::kGoToSleep);
	}